

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsPopupOpen(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  long lVar1;
  ImGuiID *pIVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  
  if ((char)popup_flags < '\0') {
    iVar4 = (GImGui->OpenPopupStack).Size;
    if (((uint)popup_flags >> 8 & 1) == 0) {
      iVar3 = (GImGui->BeginPopupStack).Size;
      bVar8 = SBORROW4(iVar4,iVar3);
      bVar7 = iVar4 == iVar3;
      iVar4 = iVar4 - iVar3;
    }
    else {
      bVar8 = false;
      bVar7 = iVar4 == 0;
    }
    return !bVar7 && bVar8 == iVar4 < 0;
  }
  if (((uint)popup_flags >> 8 & 1) == 0) {
    iVar4 = (GImGui->BeginPopupStack).Size;
    if ((GImGui->OpenPopupStack).Size <= iVar4) {
      return false;
    }
    bVar7 = (GImGui->OpenPopupStack).Data[iVar4].PopupId == id;
  }
  else {
    uVar5 = (GImGui->OpenPopupStack).Size;
    lVar6 = 0;
    do {
      lVar1 = lVar6 + 0x30;
      bVar8 = (ulong)(~((int)uVar5 >> 0x1f) & uVar5) * 0x30 + 0x30 == lVar1;
      bVar7 = !bVar8;
      if (bVar8) {
        return bVar7;
      }
      pIVar2 = (ImGuiID *)((long)&((GImGui->OpenPopupStack).Data)->PopupId + lVar6);
      lVar6 = lVar1;
    } while (*pIVar2 != id);
  }
  return bVar7;
}

Assistant:

bool ImGui::IsPopupOpen(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    if (popup_flags & ImGuiPopupFlags_AnyPopupId)
    {
        // Return true if any popup is open at the current BeginPopup() level of the popup stack
        // This may be used to e.g. test for another popups already opened to handle popups priorities at the same level.
        IM_ASSERT(id == 0);
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
            return g.OpenPopupStack.Size > 0;
        else
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size;
    }
    else
    {
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
        {
            // Return true if the popup is open anywhere in the popup stack
            for (int n = 0; n < g.OpenPopupStack.Size; n++)
                if (g.OpenPopupStack[n].PopupId == id)
                    return true;
            return false;
        }
        else
        {
            // Return true if the popup is open at the current BeginPopup() level of the popup stack (this is the most-common query)
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].PopupId == id;
        }
    }
}